

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_window_constraints.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  byte bVar20;
  char *format;
  undefined8 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  int ret_max_h;
  int ret_max_w;
  int ret_min_h;
  int ret_min_w;
  long local_80;
  ALLEGRO_EVENT event;
  
  cVar6 = al_install_system(0x5020700,atexit);
  if (cVar6 == '\0') goto LAB_0010285a;
  al_install_keyboard();
  al_init_image_addon();
  al_init_font_addon();
  al_set_new_display_flags(0x50);
  lVar14 = al_create_display(0x280,0x1e0);
  if (lVar14 == 0) {
    format = "Unable to set any graphic mode\n";
  }
  else {
    local_80 = al_load_bitmap("data/mysha.pcx");
    if (local_80 == 0) {
      format = "Unable to load image\n";
    }
    else {
      lVar15 = al_load_font("data/a4_font.tga",0,0);
      if (lVar15 == 0) {
        format = "Failed to load a4_font.tga\n";
      }
      else {
        cVar6 = al_set_window_constraints(lVar14,0x280,0x1e0,800,600);
        if (cVar6 != '\0') {
          al_apply_window_constraints(lVar14,1);
          uVar16 = al_create_event_queue();
          uVar17 = al_get_display_event_source(lVar14);
          al_register_event_source(uVar16,uVar17);
          uVar17 = al_get_keyboard_event_source();
          al_register_event_source(uVar16,uVar17);
          bVar4 = true;
          bVar3 = true;
          bVar2 = true;
          bVar1 = true;
          bVar7 = true;
          do {
            if (bVar7) {
              cVar6 = al_is_event_queue_empty(uVar16);
              bVar20 = 1;
              if (cVar6 != '\0') {
                al_map_rgb(0xff,0,0);
                al_clear_to_color();
                lVar5 = local_80;
                iVar8 = al_get_bitmap_width(local_80);
                iVar9 = al_get_bitmap_height(lVar5);
                iVar10 = al_get_display_width(lVar14);
                iVar11 = al_get_display_height(lVar14);
                uVar23 = 0;
                al_draw_scaled_bitmap
                          (0,0,(float)iVar8,(float)iVar9,0,0,(float)iVar10,(float)iVar11,lVar5,0);
                uVar22 = al_map_rgb(0xff,0xff,0xff);
                uVar12 = al_get_display_width(lVar14);
                uVar13 = al_get_display_height(lVar14);
                al_draw_textf(uVar22,uVar23,0,0,lVar15,0,"Resolution: %dx%d",uVar12,uVar13);
                cVar6 = al_get_window_constraints
                                  (lVar14,&ret_min_w,&ret_min_h,&ret_max_w,&ret_max_h);
                if (cVar6 == '\0') {
                  format = "Unable to get window constraints\n";
                  goto LAB_00102853;
                }
                uVar12 = al_map_rgb(0xff,0xff,0xff);
                iVar8 = al_get_font_line_height(lVar15);
                bVar20 = 0;
                al_draw_textf(uVar12,uVar23,0,(float)iVar8,lVar15,0,
                              "Min Width: %d, Min Height: %d, Max Width: %d, Max Height: %d",
                              ret_min_w,ret_min_h,ret_max_w,ret_max_h);
                uVar12 = al_map_rgb(0xff,0xff,0xff);
                iVar8 = al_get_font_line_height(lVar15);
                al_draw_textf(uVar12,uVar23,0,(float)(iVar8 * 2),lVar15,0,
                              "Toggle Restriction: Min Width: Z, Min Height: X, Max Width: C, Max Height: V"
                             );
                al_flip_display();
              }
            }
            else {
              bVar20 = 0;
            }
            al_wait_for_event(uVar16);
            if (event.type == 0x29) {
              al_acknowledge_resize(event.any.source);
              bVar20 = 1;
            }
            if (event.type == 10) {
              if (event.display.width == 3) {
                bVar3 = (bool)(bVar3 ^ 1);
              }
              else if (event.display.width == 0x16) {
                bVar4 = (bool)(bVar4 ^ 1);
              }
              else if (event.display.width == 0x18) {
                bVar2 = (bool)(bVar2 ^ 1);
              }
              else if (event.display.width == 0x1a) {
                bVar1 = (bool)(bVar1 ^ 1);
              }
              else if (event.display.width == 0x3b) break;
              uVar17 = 0;
              if (bVar1) {
                uVar17 = 0x280;
              }
              uVar19 = 0;
              if (bVar2) {
                uVar19 = 0x1e0;
              }
              uVar18 = 0;
              if (bVar3) {
                uVar18 = 800;
              }
              uVar21 = 0;
              if (bVar4) {
                uVar21 = 600;
              }
              cVar6 = al_set_window_constraints(lVar14,uVar17,uVar19,uVar18,uVar21);
              if (cVar6 == '\0') goto LAB_00102843;
              al_apply_window_constraints(lVar14);
              bVar7 = true;
            }
            else {
              bVar7 = (bool)(event.type == 0x28 | bVar20);
            }
          } while (event.type != 0x2a);
          al_destroy_bitmap(local_80);
          al_destroy_display(lVar14);
          return 0;
        }
LAB_00102843:
        format = "Unable to set window constraints.\n";
      }
    }
  }
LAB_00102853:
  do {
    abort_example(format);
LAB_0010285a:
    format = "Could not init Allegro.\n";
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_FONT *f;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_EVENT event;
   bool redraw;
   int min_w, min_h, max_w, max_h;
   int ret_min_w, ret_min_h, ret_max_w, ret_max_h;
   bool constr_min_w, constr_min_h, constr_max_w, constr_max_h;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();
   al_init_image_addon();
   al_init_font_addon();

   al_set_new_display_flags(ALLEGRO_RESIZABLE |
      ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Unable to set any graphic mode\n");
   }

   bmp = al_load_bitmap("data/mysha.pcx");
   if (!bmp) {
      abort_example("Unable to load image\n");
   }

   f = al_load_font("data/a4_font.tga", 0, 0);
   if (!f) {
      abort_example("Failed to load a4_font.tga\n");
   }

   min_w = 640;
   min_h = 480;
   max_w = 800;
   max_h = 600;
   constr_min_w = constr_min_h = constr_max_w = constr_max_h = true;

   if (!al_set_window_constraints(
          display,
          constr_min_w ? min_w : 0,
          constr_min_h ? min_h : 0,
          constr_max_w ? max_w : 0,
          constr_max_h ? max_h : 0)) {
      abort_example("Unable to set window constraints.\n");
   }

   al_apply_window_constraints(display, true);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_keyboard_event_source());

   redraw = true;
   while (true) {
      if (redraw && al_is_event_queue_empty(queue)) {
         al_clear_to_color(al_map_rgb(255, 0, 0));
         al_draw_scaled_bitmap(bmp,
            0, 0, al_get_bitmap_width(bmp), al_get_bitmap_height(bmp),
            0, 0, al_get_display_width(display), al_get_display_height(display),
            0);

         /* Display screen resolution */
         al_draw_textf(f, al_map_rgb(255, 255, 255), 0, 0, 0,
            "Resolution: %dx%d",
            al_get_display_width(display), al_get_display_height(display));

         if (!al_get_window_constraints(display, &ret_min_w, &ret_min_h,
               &ret_max_w, &ret_max_h))
         {
            abort_example("Unable to get window constraints\n");
         }

         al_draw_textf(f, al_map_rgb(255, 255, 255), 0,
            al_get_font_line_height(f), 0,
            "Min Width: %d, Min Height: %d, Max Width: %d, Max Height: %d",
            ret_min_w, ret_min_h, ret_max_w, ret_max_h);

         al_draw_textf(f, al_map_rgb(255, 255, 255), 0,
            al_get_font_line_height(f) * 2,0,
            "Toggle Restriction: Min Width: Z, Min Height: X, Max Width: C, Max Height: V");

         al_flip_display();
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_RESIZE) {
         al_acknowledge_resize(event.display.source);
         redraw = true;
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_EXPOSE) {
         redraw = true;
      }
      if (event.type == ALLEGRO_EVENT_KEY_DOWN) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
            break;
         }
         else if (event.keyboard.keycode == ALLEGRO_KEY_Z) {
            constr_min_w = ! constr_min_w;
         }
         else if (event.keyboard.keycode == ALLEGRO_KEY_X) {
            constr_min_h = ! constr_min_h;
         }
         else if (event.keyboard.keycode == ALLEGRO_KEY_C) {
            constr_max_w = ! constr_max_w;
         }
         else if (event.keyboard.keycode == ALLEGRO_KEY_V) {
            constr_max_h = ! constr_max_h;
         }

         redraw = true;

         if (!al_set_window_constraints(display,
               constr_min_w ? min_w : 0,
               constr_min_h ? min_h : 0,
               constr_max_w ? max_w : 0,
               constr_max_h ? max_h : 0)) {
            abort_example("Unable to set window constraints.\n");
         }
         al_apply_window_constraints(display, true);
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
   }

   al_destroy_bitmap(bmp);
   al_destroy_display(display);

   return 0;
}